

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall
tonk::SessionOutgoing::sendQueuedReliable
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint reliableOffset)

{
  uint uVar1;
  SiameseResult SVar2;
  uint sequenceNumberBytes;
  _func_int **pp_Var3;
  uint in_ECX;
  undefined4 in_register_00000014;
  OutgoingQueuedDatagram *datagram_00;
  allocator local_59;
  string local_58 [32];
  SiameseOriginalPacket original;
  
  datagram_00 = (OutgoingQueuedDatagram *)CONCAT44(in_register_00000014,reliableOffset);
  uVar1 = datagram_00->NextWriteOffset - in_ECX;
  if (datagram_00->NextWriteOffset < in_ECX || uVar1 == 0) {
    sequenceNumberBytes = 0;
    uVar1 = 0;
  }
  else {
    original.Data = datagram_00->Data + in_ECX;
    original.PacketNum = 0;
    original.DataBytes = uVar1;
    SVar2 = siamese_encoder_add((SiameseEncoder)datagram[0x1e].Next,&original);
    uVar1 = original.PacketNum;
    if (SVar2 != Siamese_Success) {
      std::__cxx11::string::string(local_58,"siamese_encoder_add failed",&local_59);
      pp_Var3 = (_func_int **)operator_new(0x38);
      *pp_Var3 = (_func_int *)"SessionOutgoing::Flush";
      std::__cxx11::string::string((string *)(pp_Var3 + 1),local_58);
      *(undefined4 *)(pp_Var3 + 5) = 1;
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var3;
      pp_Var3[6] = (_func_int *)(long)(int)SVar2;
      std::__cxx11::string::~string(local_58);
      return (Result)(ErrorResult *)this;
    }
    sequenceNumberBytes = getPacketNumBytes((SessionOutgoing *)datagram,original.PacketNum);
    datagram[0x20].NextWriteOffset = uVar1 + 1 & 0x3fffff;
  }
  sendQueuedDatagram((SessionOutgoing *)datagram,datagram_00,sequenceNumberBytes,uVar1);
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::sendQueuedReliable(
    OutgoingQueuedDatagram* datagram,
    unsigned reliableOffset)
{
    TONK_DEBUG_ASSERT(datagram->NextWriteOffset >= reliableOffset);
    if (datagram->NextWriteOffset <= reliableOffset) {
        sendQueuedDatagram(datagram, 0, 0);
        return Result::Success();
    }

    SiameseOriginalPacket original;
    original.Data = datagram->Data + reliableOffset;
    original.DataBytes = datagram->NextWriteOffset - reliableOffset;
    original.PacketNum = 0;

    // Add reliable data to the Siamese FEC encoder
    const int addResult = siamese_encoder_add(FECEncoder, &original);

    if (addResult != Siamese_Success) {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SessionOutgoing::Flush", "siamese_encoder_add failed", ErrorType::Siamese, addResult);
    }

    const unsigned packetNum = original.PacketNum;
    const unsigned packetNumBytes = getPacketNumBytes(packetNum);

    // Update last sent packet sequence number.
    // Used for AckAck generation and sequence number compression
    TONK_DEBUG_ASSERT(NextSequenceNumber == packetNum);
    NextSequenceNumber = SIAMESE_PACKET_NUM_INC(packetNum);

    sendQueuedDatagram(datagram, packetNumBytes, packetNum);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    m_Reliable++;
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}